

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::evaluateBrand
          (BrandScope *this,Resolver *resolver,ResolvedDecl *decl,Reader brand,uint index)

{
  short sVar1;
  Reader type;
  Reader source;
  undefined1 auVar2 [40];
  Reader brand_00;
  ArrayPtr<capnp::compiler::BrandedDecl> content;
  undefined4 in_register_0000000c;
  unsigned_long *params_1;
  uint64_t uVar3;
  BrandScope *extraout_RDX;
  BrandScope *extraout_RDX_00;
  BrandScope *pBVar4;
  ElementCount in_R8D;
  ulong count;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar5;
  BrandedDecl *in_stack_fffffffffffffc90;
  size_t in_stack_fffffffffffffc98;
  ArrayBuilder<capnp::compiler::BrandedDecl> params;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
  local_318;
  Reader bindings;
  Array<capnp::compiler::BrandedDecl> result;
  undefined8 local_290;
  undefined1 local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  size_t local_1f8;
  ArrayDisposer *pAStack_1f0;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_198;
  Reader nextScope;
  ResolvedDecl anyPointerDecl;
  Reader local_f8;
  ResolvedDecl local_c8;
  Reader binding;
  
  params_1 = (unsigned_long *)CONCAT44(in_register_0000000c,index);
  kj::refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&>
            ((kj *)this,(ErrorReporter *)resolver[2]._vptr_Resolver,params_1);
  *(int *)(*(long *)&(this->super_Refcounted).refcount + 0x30) = (int)params_1[1];
  if (in_R8D < brand.reader.elementCount) {
    capnp::_::ListReader::getStructElement(&nextScope._reader,&brand.reader,in_R8D);
    if (nextScope._reader.dataSize < 0x40) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(uint64_t *)CONCAT17(nextScope._reader.data._7_1_,nextScope._reader.data._0_7_);
    }
    if (*params_1 == uVar3) {
      if ((nextScope._reader.dataSize < 0x50) ||
         (sVar1 = *(short *)(CONCAT17(nextScope._reader.data._7_1_,nextScope._reader.data._0_7_) + 8
                            ), sVar1 == 0)) {
        capnp::schema::Brand::Scope::Reader::getBind(&bindings,&nextScope);
        count = (ulong)bindings.reader.elementCount;
        params.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::compiler::BrandedDecl>
                               (count);
        params.endPtr = params.ptr + count;
        params.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        params.pos = params.ptr;
        local_318.container = &bindings;
        for (local_318.index = 0; local_318.index != bindings.reader.elementCount;
            local_318.index = local_318.index + 1) {
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
          ::operator*(&binding,&local_318);
          if ((binding._reader.dataSize < 0x10) || (*binding._reader.data == 0)) {
            (**(code **)(decl->id + 0x10))(&anyPointerDecl,decl,0x1e);
            local_c8.brand.ptr.isSet = anyPointerDecl.brand.ptr.isSet;
            if (anyPointerDecl.brand.ptr.isSet == true) {
              local_c8.brand.ptr.field_1._32_8_ = anyPointerDecl.brand.ptr.field_1._32_8_;
              local_c8.brand.ptr.field_1._40_8_ = anyPointerDecl.brand.ptr.field_1._40_8_;
              local_c8.brand.ptr.field_1.value._reader.data =
                   anyPointerDecl.brand.ptr.field_1.value._reader.data;
              local_c8.brand.ptr.field_1.value._reader.pointers =
                   anyPointerDecl.brand.ptr.field_1.value._reader.pointers;
              local_c8.brand.ptr.field_1.value._reader.capTable =
                   anyPointerDecl.brand.ptr.field_1.value._reader.capTable;
            }
            kj::
            refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&>
                      ((kj *)&local_198,(ErrorReporter *)resolver[2]._vptr_Resolver,
                       &anyPointerDecl.scopeId);
            auVar2 = ZEXT1640(ZEXT816(0));
            source._reader._40_8_ = 0x7fffffff;
            source._reader.segment = (SegmentReader *)auVar2._0_8_;
            source._reader.capTable = (CapTableReader *)auVar2._8_8_;
            source._reader.data = (void *)auVar2._16_8_;
            source._reader.pointers = (WirePointer *)auVar2._24_8_;
            source._reader.dataSize = auVar2._32_4_;
            source._reader.pointerCount = auVar2._36_2_;
            source._reader._38_2_ = auVar2._38_2_;
            BrandedDecl::BrandedDecl((BrandedDecl *)&result,&local_c8,&local_198,source);
            BrandedDecl::BrandedDecl(params.pos,(BrandedDecl *)&result);
            params.pos = params.pos + 1;
            BrandedDecl::~BrandedDecl((BrandedDecl *)&result);
            kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&local_198);
          }
          else if (*binding._reader.data == 1) {
            capnp::schema::Brand::Binding::Reader::getType(&local_f8,&binding);
            type._reader.capTable = local_f8._reader.capTable;
            type._reader.segment = local_f8._reader.segment;
            type._reader.data = local_f8._reader.data;
            type._reader.pointers = local_f8._reader.pointers;
            type._reader.dataSize = local_f8._reader.dataSize;
            type._reader.pointerCount = local_f8._reader.pointerCount;
            type._reader._38_2_ = local_f8._reader._38_2_;
            type._reader.nestingLimit = local_f8._reader.nestingLimit;
            type._reader._44_4_ = local_f8._reader._44_4_;
            decompileType((BrandedDecl *)&result,(BrandScope *)resolver,(Resolver *)decl,type);
            BrandedDecl::BrandedDecl(params.pos,(BrandedDecl *)&result);
            params.pos = params.pos + 1;
            BrandedDecl::~BrandedDecl((BrandedDecl *)&result);
          }
        }
        result.size_ = ((long)params.pos - (long)params.ptr) / 0xa8;
        result.ptr = params.ptr;
        result.disposer = params.disposer;
        params.endPtr = (BrandedDecl *)0x0;
        params.ptr = (BrandedDecl *)0x0;
        params.pos = (RemoveConst<capnp::compiler::BrandedDecl> *)0x0;
        kj::Array<capnp::compiler::BrandedDecl>::operator=
                  ((Array<capnp::compiler::BrandedDecl> *)
                   (*(long *)&(this->super_Refcounted).refcount + 0x38),&result);
        kj::Array<capnp::compiler::BrandedDecl>::~Array(&result);
        kj::ArrayBuilder<capnp::compiler::BrandedDecl>::dispose(&params);
      }
      else if (sVar1 == 1) {
        getParams((Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)&result,
                  (BrandScope *)resolver,*params_1);
        if ((char)result.ptr == '\x01') {
          content.size_ = in_stack_fffffffffffffc98;
          content.ptr = in_stack_fffffffffffffc90;
          kj::heapArray<capnp::compiler::BrandedDecl>(content);
          kj::Array<capnp::compiler::BrandedDecl>::operator=
                    ((Array<capnp::compiler::BrandedDecl> *)
                     (*(long *)&(this->super_Refcounted).refcount + 0x38),&result);
          kj::Array<capnp::compiler::BrandedDecl>::~Array(&result);
        }
        else {
          *(undefined1 *)(*(long *)&(this->super_Refcounted).refcount + 0x34) = 1;
        }
      }
    }
  }
  (**(code **)(*(long *)params_1[4] + 0x20))(&result);
  pBVar4 = extraout_RDX;
  if ((char)result.ptr == '\x01') {
    nextScope._reader.data._7_1_ = (undefined1)local_290;
    nextScope._reader.pointers._0_7_ = (undefined7)((ulong)local_290 >> 8);
    nextScope._reader._7_8_ = result.size_;
    nextScope._reader.capTable._7_1_ = SUB81(result.disposer,0);
    nextScope._reader.data._0_7_ = (undefined7)((ulong)result.disposer >> 8);
    if (local_278 != '\0') {
      anyPointerDecl.resolver._7_1_ = (undefined1)local_250;
      anyPointerDecl.brand.ptr.isSet = SUB81((ulong)local_250 >> 8,0);
      anyPointerDecl.brand.ptr._1_6_ = SUB86((ulong)local_250 >> 0x10,0);
      anyPointerDecl.brand.ptr._7_1_ = SUB81(uStack_248,0);
      anyPointerDecl.brand.ptr.field_1._0_7_ = (undefined7)((ulong)uStack_248 >> 8);
      anyPointerDecl.scopeId._7_1_ = (undefined1)local_260;
      anyPointerDecl._24_7_ = SUB87((ulong)local_260 >> 8,0);
      anyPointerDecl._31_1_ = SUB81(uStack_258,0);
      anyPointerDecl.resolver._0_7_ = (undefined7)((ulong)uStack_258 >> 8);
      anyPointerDecl.id._7_1_ = (undefined1)local_270;
      anyPointerDecl._8_7_ = SUB87((ulong)local_270 >> 8,0);
      anyPointerDecl._15_1_ = SUB81(uStack_268,0);
      anyPointerDecl.scopeId._0_7_ = (undefined7)((ulong)uStack_268 >> 8);
    }
    pAStack_1f0 = result.disposer;
    local_1f8 = result.size_;
    brand_00.reader.step = brand.reader.step;
    brand_00.reader.elementCount = brand.reader.elementCount;
    brand_00.reader.capTable = brand.reader.capTable;
    brand_00.reader.segment = brand.reader.segment;
    brand_00.reader.ptr = brand.reader.ptr;
    brand_00.reader.structDataSize = brand.reader.structDataSize;
    brand_00.reader.structPointerCount = brand.reader.structPointerCount;
    brand_00.reader.elementSize = brand.reader.elementSize;
    brand_00.reader._39_1_ = brand.reader._39_1_;
    brand_00.reader.nestingLimit = brand.reader.nestingLimit;
    brand_00.reader._44_4_ = brand.reader._44_4_;
    evaluateBrand((BrandScope *)&bindings,resolver,decl,brand_00,(uint)&local_1f8);
    result.size_ = (size_t)bindings.reader.capTable;
    bindings.reader.capTable = (CapTableReader *)0x0;
    result.ptr = (BrandedDecl *)bindings.reader.segment;
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator=
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)
               (*(long *)&(this->super_Refcounted).refcount + 0x18),
               (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&result);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&result);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&bindings);
    pBVar4 = extraout_RDX_00;
  }
  OVar5.ptr = pBVar4;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<BrandScope> BrandScope::evaluateBrand(
    Resolver& resolver, Resolver::ResolvedDecl decl,
    List<schema::Brand::Scope>::Reader brand, uint index) {
  auto result = kj::refcounted<BrandScope>(errorReporter, decl.id);
  result->leafParamCount = decl.genericParamCount;

  // Fill in `params`.
  if (index < brand.size()) {
    auto nextScope = brand[index];
    if (decl.id == nextScope.getScopeId()) {
      // Initialize our parameters.

      switch (nextScope.which()) {
        case schema::Brand::Scope::BIND: {
          auto bindings = nextScope.getBind();
          auto params = kj::heapArrayBuilder<BrandedDecl>(bindings.size());
          for (auto binding: bindings) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND: {
                // Build an AnyPointer-equivalent.
                auto anyPointerDecl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
                params.add(BrandedDecl(anyPointerDecl,
                    kj::refcounted<BrandScope>(errorReporter, anyPointerDecl.scopeId),
                    Expression::Reader()));
                break;
              }

              case schema::Brand::Binding::TYPE:
                // Reverse this schema::Type back into a BrandedDecl.
                params.add(decompileType(resolver, binding.getType()));
                break;
            }
          }
          result->params = params.finish();
          break;
        }

        case schema::Brand::Scope::INHERIT:
          KJ_IF_SOME(p, getParams(decl.id)) {
            result->params = kj::heapArray(p);
          } else {
            result->inherited = true;
          }
          break;
      }

      // Parent should start one level deeper in the list.
      ++index;
    }
  }